

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsPipeline.cpp
# Opt level: O0

Ptr<GraphicsPipeline>
myvk::GraphicsPipeline::Create
          (Ptr<PipelineLayout> *pipeline_layout,Ptr<RenderPass> *render_pass,
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *shader_stages,GraphicsPipelineState *pipeline_state,uint32_t subpass)

{
  PFN_vkCreateGraphicsPipelines p_Var1;
  VkResult VVar2;
  element_type *this;
  element_type *peVar3;
  size_type sVar4;
  element_type *peVar5;
  VkDevice pVVar6;
  VkPipelineCache this_00;
  element_type *peVar7;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  GraphicsPipelineState *in_R8;
  uint32_t in_R9D;
  Ptr<GraphicsPipeline> PVar8;
  VkGraphicsPipelineCreateInfo create_info;
  shared_ptr<myvk::GraphicsPipeline> ret;
  uint in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  shared_ptr<myvk::PipelineLayout> *in_stack_fffffffffffffea0;
  VkGraphicsPipelineCreateInfo local_d8;
  uint32_t local_2c;
  GraphicsPipelineState *local_28;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *local_20;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::make_shared<myvk::GraphicsPipeline>();
  std::__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2da32d);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            (in_stack_fffffffffffffea0,
             (shared_ptr<myvk::PipelineLayout> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2da355);
  std::shared_ptr<myvk::RenderPass>::operator=
            ((shared_ptr<myvk::RenderPass> *)in_stack_fffffffffffffea0,
             (shared_ptr<myvk::RenderPass> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_d8.basePipelineHandle = (VkPipeline)0x0;
  local_d8.basePipelineIndex = 0;
  local_d8._140_4_ = 0;
  local_d8.renderPass = (VkRenderPass)0x0;
  local_d8.subpass = 0;
  local_d8._124_4_ = 0;
  local_d8.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_d8.layout = (VkPipelineLayout)0x0;
  local_d8.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  local_d8.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  local_d8.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)0x0;
  local_d8.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
  local_d8.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_d8.pViewportState = (VkPipelineViewportStateCreateInfo *)0x0;
  local_d8.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  local_d8.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  local_d8.flags = 0;
  local_d8.stageCount = 0;
  local_d8.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  local_d8.pNext = (void *)0x0;
  local_d8.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_d8._4_4_ = 0;
  this = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2da3ce);
  local_d8.renderPass = RenderPass::GetHandle(this);
  peVar3 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2da3f7);
  local_d8.layout = PipelineLayout::GetHandle(peVar3);
  sVar4 = std::
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          ::size(local_20);
  local_d8.stageCount = (uint32_t)sVar4;
  local_d8.pStages =
       std::
       vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
       data((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
             *)0x2da434);
  GraphicsPipelineState::PopGraphicsPipelineCreateInfo(local_28,&local_d8);
  p_Var1 = vkCreateGraphicsPipelines;
  local_d8.subpass = local_2c;
  peVar3 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2da47d);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar5 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2da49a);
  pVVar6 = Device::GetHandle(peVar5);
  peVar3 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2da4b6);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar5 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2da4d3);
  this_00 = Device::GetPipelineCacheHandle(peVar5);
  peVar7 = std::
           __shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2da4ef);
  VVar2 = (*p_Var1)(pVVar6,this_00,1,&local_d8,(VkAllocationCallbacks *)0x0,
                    &(peVar7->super_PipelineBase).m_pipeline);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::GraphicsPipeline>::shared_ptr
              ((shared_ptr<myvk::GraphicsPipeline> *)this_00,
               (shared_ptr<myvk::GraphicsPipeline> *)(ulong)in_stack_fffffffffffffe98);
  }
  else {
    std::shared_ptr<myvk::GraphicsPipeline>::shared_ptr
              ((shared_ptr<myvk::GraphicsPipeline> *)this_00,
               (nullptr_t)CONCAT44(VVar2,in_stack_fffffffffffffe98));
  }
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x2da590);
  PVar8.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<GraphicsPipeline>)
         PVar8.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<GraphicsPipeline> GraphicsPipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                               const Ptr<RenderPass> &render_pass,
                                               const std::vector<VkPipelineShaderStageCreateInfo> &shader_stages,
                                               const GraphicsPipelineState &pipeline_state, uint32_t subpass) {
	auto ret = std::make_shared<GraphicsPipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;
	ret->m_render_pass_ptr = render_pass;

	VkGraphicsPipelineCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
	create_info.renderPass = render_pass->GetHandle();
	create_info.layout = pipeline_layout->GetHandle();
	create_info.stageCount = shader_stages.size();
	create_info.pStages = shader_stages.data();
	pipeline_state.PopGraphicsPipelineCreateInfo(&create_info);
	create_info.subpass = subpass;

	if (vkCreateGraphicsPipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                              pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &create_info, nullptr,
	                              &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}